

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int lj_cf_string_gmatch_aux(lua_State *L)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  uint *puVar4;
  MatchState *ms_00;
  MatchState *e_00;
  long in_RDI;
  int32_t pos;
  char *e;
  MatchState ms;
  char *src;
  TValue *tvpos;
  char *s;
  GCstr *str;
  char *p;
  uint local_264;
  char *s_00;
  char *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  MatchState *in_stack_fffffffffffffdf0;
  MatchState *local_38;
  
  uVar2 = (ulong)*(uint *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -8) + 0x20);
  pcVar3 = (char *)(uVar2 + 0x10);
  puVar4 = (uint *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -8) + 0x30);
  local_38 = (MatchState *)(pcVar3 + *puVar4);
  ms_00 = (MatchState *)(pcVar3 + *(uint *)(uVar2 + 0xc));
  s_00 = pcVar3;
  while( true ) {
    if (ms_00 < local_38) {
      return 0;
    }
    e_00 = (MatchState *)
           match(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    if (e_00 != (MatchState *)0x0) break;
    local_38 = (MatchState *)((long)&local_38->src_init + 1);
  }
  local_264 = (int)e_00 - (int)pcVar3;
  if (e_00 == local_38) {
    local_264 = local_264 + 1;
  }
  *puVar4 = local_264;
  iVar1 = push_captures(ms_00,s_00,(char *)e_00);
  return iVar1;
}

Assistant:

LJLIB_NOREG LJLIB_CF(string_gmatch_aux)
{
  const char *p = strVdata(lj_lib_upvalue(L, 2));
  GCstr *str = strV(lj_lib_upvalue(L, 1));
  const char *s = strdata(str);
  TValue *tvpos = lj_lib_upvalue(L, 3);
  const char *src = s + tvpos->u32.lo;
  MatchState ms;
  ms.L = L;
  ms.src_init = s;
  ms.src_end = s + str->len;
  for (; src <= ms.src_end; src++) {
    const char *e;
    ms.level = ms.depth = 0;
    if ((e = match(&ms, src, p)) != NULL) {
      int32_t pos = (int32_t)(e - s);
      if (e == src) pos++;  /* Ensure progress for empty match. */
      tvpos->u32.lo = (uint32_t)pos;
      return push_captures(&ms, src, e);
    }
  }
  return 0;  /* not found */
}